

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soplex.hpp
# Opt level: O1

bool __thiscall
soplex::
SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::getRowViolation(SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  *this,number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *maxviol,
                 number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *sumviol)

{
  undefined8 uVar1;
  bool bVar2;
  SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar3;
  int iVar4;
  long lVar5;
  ulong unaff_RBP;
  long lVar6;
  cpp_dec_float<50U,_int,_void> *pcVar7;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_1;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  activity;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  lhs;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  rhs;
  cpp_dec_float<50U,_int,_void> local_148;
  cpp_dec_float<50U,_int,_void> *local_108;
  uint local_fc;
  cpp_dec_float<50U,_int,_void> local_f8;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  local_c0;
  SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_a8;
  cpp_dec_float<50U,_int,_void> local_a0;
  cpp_dec_float<50U,_int,_void> local_68;
  
  if ((this->_hasSolReal != true) ||
     (unaff_RBP = CONCAT71((int7)(unaff_RBP >> 8),1), ((this->_solReal).field_0xc8 & 1) == 0)) {
    if (this->_hasSolRational == true) {
      unaff_RBP = CONCAT71((int7)(unaff_RBP >> 8),(this->_solRational).field_0xd0) &
                  0xffffffffffffff01;
    }
    else {
      unaff_RBP = 0;
    }
  }
  if ((char)unaff_RBP != '\0') {
    local_108 = &sumviol->m_backend;
    if ((this->_hasSolReal == false) && (this->_hasSolRational != false)) {
      SolBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
      ::operator=((SolBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                   *)&this->_solReal,&this->_solRational);
      this->_hasSolReal = true;
    }
    VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::VectorBase(&local_c0,
                 (this->_realLP->
                 super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).
                 super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .set.thenum);
    (*(this->_realLP->
      super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ).
      super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      .
      super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
      ._vptr_ClassArray[0x46])(this->_realLP,&this->_solReal,&local_c0,1);
    boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
              ((cpp_dec_float<50u,int,void> *)maxviol,0.0);
    local_fc = (uint)unaff_RBP;
    boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
              ((cpp_dec_float<50u,int,void> *)local_108,0.0);
    lVar6 = (long)(this->_realLP->
                  super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).
                  super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  .set.thenum;
    local_a8 = this;
    if (0 < lVar6) {
      lVar5 = lVar6 * 0x38;
      do {
        pSVar3 = local_a8;
        SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::lhsUnscaled((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *)&local_a0,local_a8->_realLP,(int)(lVar6 + -1));
        SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::rhsUnscaled((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *)&local_68,pSVar3->_realLP,(int)lVar6 + -1);
        pcVar7 = (cpp_dec_float<50U,_int,_void> *)
                 ((long)local_c0.val.
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data._M_elems +
                 lVar5);
        local_148.fpclass = cpp_dec_float_finite;
        local_148.prec_elem = 10;
        local_148.data._M_elems[0] = 0;
        local_148.data._M_elems[1] = 0;
        local_148.data._M_elems[2] = 0;
        local_148.data._M_elems[3] = 0;
        local_148.data._M_elems[4] = 0;
        local_148.data._M_elems[5] = 0;
        local_148.data._M_elems._24_5_ = 0;
        local_148.data._M_elems[7]._1_3_ = 0;
        local_148.data._M_elems._32_5_ = 0;
        local_148.data._M_elems[9]._1_3_ = 0;
        local_148.exp = 0;
        local_148.neg = false;
        if (pcVar7 == &local_148) {
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                    (&local_148,&local_a0);
          if (local_148.data._M_elems[0] != 0 || local_148.fpclass != cpp_dec_float_finite) {
            local_148.neg = (bool)(local_148.neg ^ 1);
          }
        }
        else {
          local_148.data._M_elems._32_5_ = local_a0.data._M_elems._32_5_;
          local_148.data._M_elems[9]._1_3_ = local_a0.data._M_elems[9]._1_3_;
          local_148.data._M_elems[4] = local_a0.data._M_elems[4];
          local_148.data._M_elems[5] = local_a0.data._M_elems[5];
          local_148.data._M_elems._24_5_ = local_a0.data._M_elems._24_5_;
          local_148.data._M_elems[7]._1_3_ = local_a0.data._M_elems[7]._1_3_;
          local_148.data._M_elems[0] = local_a0.data._M_elems[0];
          local_148.data._M_elems[1] = local_a0.data._M_elems[1];
          local_148.data._M_elems[2] = local_a0.data._M_elems[2];
          local_148.data._M_elems[3] = local_a0.data._M_elems[3];
          local_148.exp = local_a0.exp;
          local_148.neg = local_a0.neg;
          local_148.fpclass = local_a0.fpclass;
          local_148.prec_elem = local_a0.prec_elem;
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                    (&local_148,pcVar7);
        }
        if (local_148.fpclass != cpp_dec_float_NaN) {
          local_f8.fpclass = cpp_dec_float_finite;
          local_f8.prec_elem = 10;
          local_f8.data._M_elems[0] = 0;
          local_f8.data._M_elems[1] = 0;
          local_f8.data._M_elems[2] = 0;
          local_f8.data._M_elems[3] = 0;
          local_f8.data._M_elems[4] = 0;
          local_f8.data._M_elems[5] = 0;
          local_f8.data._M_elems._24_5_ = 0;
          local_f8.data._M_elems[7]._1_3_ = 0;
          local_f8.data._M_elems._32_5_ = 0;
          local_f8.data._M_elems[9]._1_3_ = 0;
          local_f8.exp = 0;
          local_f8.neg = false;
          boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                    ((cpp_dec_float<50u,int,void> *)&local_f8,0.0);
          iVar4 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                            (&local_148,&local_f8);
          if (0 < iVar4) {
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                      (local_108,&local_148);
            if ((local_148.fpclass != cpp_dec_float_NaN) &&
               ((maxviol->m_backend).fpclass != cpp_dec_float_NaN)) {
              iVar4 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                (&local_148,&maxviol->m_backend);
              if (0 < iVar4) {
                *(ulong *)((maxviol->m_backend).data._M_elems + 8) =
                     CONCAT35(local_148.data._M_elems[9]._1_3_,local_148.data._M_elems._32_5_);
                *(undefined8 *)((maxviol->m_backend).data._M_elems + 4) =
                     local_148.data._M_elems._16_8_;
                *(ulong *)((maxviol->m_backend).data._M_elems + 6) =
                     CONCAT35(local_148.data._M_elems[7]._1_3_,local_148.data._M_elems._24_5_);
                *(undefined8 *)(maxviol->m_backend).data._M_elems = local_148.data._M_elems._0_8_;
                *(undefined8 *)((maxviol->m_backend).data._M_elems + 2) =
                     local_148.data._M_elems._8_8_;
                (maxviol->m_backend).exp = local_148.exp;
                (maxviol->m_backend).neg = local_148.neg;
                (maxviol->m_backend).fpclass = local_148.fpclass;
                (maxviol->m_backend).prec_elem = local_148.prec_elem;
              }
            }
          }
        }
        pcVar7 = (cpp_dec_float<50U,_int,_void> *)
                 ((long)local_c0.val.
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data._M_elems +
                 lVar5);
        local_f8.fpclass = cpp_dec_float_finite;
        local_f8.prec_elem = 10;
        local_f8.data._M_elems[0] = 0;
        local_f8.data._M_elems[1] = 0;
        local_f8.data._M_elems[2] = 0;
        local_f8.data._M_elems[3] = 0;
        local_f8.data._M_elems[4] = 0;
        local_f8.data._M_elems[5] = 0;
        local_f8.data._M_elems._24_5_ = 0;
        local_f8.data._M_elems[7]._1_3_ = 0;
        local_f8.data._M_elems._32_5_ = 0;
        local_f8.data._M_elems[9]._1_3_ = 0;
        local_f8.exp = 0;
        local_f8.neg = false;
        if (pcVar7 != &local_f8) {
          uVar1 = *(undefined8 *)((pcVar7->data)._M_elems + 8);
          local_f8.data._M_elems._32_5_ = SUB85(uVar1,0);
          local_f8.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar1 >> 0x28);
          local_f8.data._M_elems._0_8_ = *(undefined8 *)(pcVar7->data)._M_elems;
          local_f8.data._M_elems._8_8_ = *(undefined8 *)((pcVar7->data)._M_elems + 2);
          local_f8.data._M_elems._16_8_ = *(undefined8 *)((pcVar7->data)._M_elems + 4);
          uVar1 = *(undefined8 *)((pcVar7->data)._M_elems + 6);
          local_f8.data._M_elems._24_5_ = SUB85(uVar1,0);
          local_f8.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar1 >> 0x28);
          local_f8.exp = *(int *)((long)(&local_c0.val.
                                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.
                                          data + 1) + lVar5);
          local_f8.neg = *(bool *)((long)(&local_c0.val.
                                           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.
                                           data + 1) + lVar5 + 4);
          local_f8._48_8_ =
               *(undefined8 *)
                ((long)(&local_c0.val.
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data + 1) +
                lVar5 + 8);
        }
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                  (&local_f8,&local_68);
        local_148.data._M_elems._32_5_ = local_f8.data._M_elems._32_5_;
        local_148.data._M_elems[9]._1_3_ = local_f8.data._M_elems[9]._1_3_;
        local_148.data._M_elems[4] = local_f8.data._M_elems[4];
        local_148.data._M_elems[5] = local_f8.data._M_elems[5];
        local_148.data._M_elems._24_5_ = local_f8.data._M_elems._24_5_;
        local_148.data._M_elems[7]._1_3_ = local_f8.data._M_elems[7]._1_3_;
        local_148.data._M_elems[0] = local_f8.data._M_elems[0];
        local_148.data._M_elems[1] = local_f8.data._M_elems[1];
        local_148.data._M_elems[2] = local_f8.data._M_elems[2];
        local_148.data._M_elems[3] = local_f8.data._M_elems[3];
        local_148.exp = local_f8.exp;
        local_148.neg = local_f8.neg;
        local_148.fpclass = local_f8.fpclass;
        local_148.prec_elem = local_f8.prec_elem;
        if (local_f8.fpclass != cpp_dec_float_NaN) {
          local_f8.fpclass = cpp_dec_float_finite;
          local_f8.prec_elem = 10;
          local_f8.data._M_elems[0] = 0;
          local_f8.data._M_elems[1] = 0;
          local_f8.data._M_elems[2] = 0;
          local_f8.data._M_elems[3] = 0;
          local_f8.data._M_elems[4] = 0;
          local_f8.data._M_elems[5] = 0;
          local_f8.data._M_elems._24_5_ = 0;
          local_f8.data._M_elems[7]._1_3_ = 0;
          local_f8.data._M_elems._32_5_ = 0;
          local_f8.data._M_elems[9]._1_3_ = 0;
          local_f8.exp = 0;
          local_f8.neg = false;
          boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                    ((cpp_dec_float<50u,int,void> *)&local_f8,0.0);
          iVar4 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                            (&local_148,&local_f8);
          if (0 < iVar4) {
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                      (local_108,&local_148);
            if ((local_148.fpclass != cpp_dec_float_NaN) &&
               ((maxviol->m_backend).fpclass != cpp_dec_float_NaN)) {
              iVar4 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                (&local_148,&maxviol->m_backend);
              if (0 < iVar4) {
                *(ulong *)((maxviol->m_backend).data._M_elems + 8) =
                     CONCAT35(local_148.data._M_elems[9]._1_3_,local_148.data._M_elems._32_5_);
                *(undefined8 *)((maxviol->m_backend).data._M_elems + 4) =
                     local_148.data._M_elems._16_8_;
                *(ulong *)((maxviol->m_backend).data._M_elems + 6) =
                     CONCAT35(local_148.data._M_elems[7]._1_3_,local_148.data._M_elems._24_5_);
                *(undefined8 *)(maxviol->m_backend).data._M_elems = local_148.data._M_elems._0_8_;
                *(undefined8 *)((maxviol->m_backend).data._M_elems + 2) =
                     local_148.data._M_elems._8_8_;
                (maxviol->m_backend).exp = local_148.exp;
                (maxviol->m_backend).neg = local_148.neg;
                (maxviol->m_backend).fpclass = local_148.fpclass;
                (maxviol->m_backend).prec_elem = local_148.prec_elem;
              }
            }
          }
        }
        bVar2 = 1 < lVar6;
        lVar6 = lVar6 + -1;
        lVar5 = lVar5 + -0x38;
      } while (bVar2);
    }
    if (local_c0.val.
        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_c0.val.
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_c0.val.
                            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_c0.val.
                            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    unaff_RBP = (ulong)local_fc;
  }
  return (bool)(char)unaff_RBP;
}

Assistant:

bool SoPlexBase<R>::getRowViolation(R& maxviol, R& sumviol)
{
   if(!isPrimalFeasible())
      return false;

   _syncRealSolution();
   VectorBase<R>& primal = _solReal._primal;
   assert(primal.dim() == numCols());

   VectorBase<R> activity(numRows());
   _realLP->computePrimalActivity(primal, activity, true);
   maxviol = 0.0;
   sumviol = 0.0;

   for(int i = numRows() - 1; i >= 0; i--)
   {
      R lhs = _realLP->lhsUnscaled(i);
      R rhs = _realLP->rhsUnscaled(i);

      R viol = lhs - activity[i];

      if(viol > 0.0)
      {
         sumviol += viol;

         if(viol > maxviol)
            maxviol = viol;
      }

      viol = activity[i] - rhs;

      if(viol > 0.0)
      {
         sumviol += viol;

         if(viol > maxviol)
            maxviol = viol;
      }
   }

   return true;
}